

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

void subip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  long lVar1;
  long lVar2;
  uint16_t *puVar3;
  uint16_t uVar4;
  ushort uVar5;
  ushort uVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  bool bVar10;
  
  if (na == 0 || nb == 0) {
    bVar8 = false;
    bVar7 = false;
  }
  else {
    bVar8 = false;
    bVar7 = false;
    lVar9 = 0;
    do {
      uVar5 = a[na + lVar9 + -1];
      uVar6 = b[nb + lVar9 + -1];
      if (bVar7) {
        bVar7 = uVar5 <= uVar6;
        a[na + lVar9 + -1] = ~uVar6 + uVar5;
        bVar8 = bVar7;
      }
      else {
        a[na + lVar9 + -1] = uVar5 - uVar6;
        if (uVar5 < uVar6) {
          bVar8 = true;
          bVar7 = true;
        }
      }
      lVar1 = lVar9 + -1;
    } while ((nb + lVar9 != 1) && (lVar2 = na + lVar9, lVar9 = lVar1, lVar2 != 1));
    nb = nb + lVar1;
    na = na + lVar1;
  }
  while (bVar10 = nb != 0, nb = nb - 1, bVar10) {
    if (b[nb] != 0) {
      __assert_fail("!b[ib]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x4be,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
    }
  }
  if ((na != 0) && (bVar7)) {
    do {
      bVar7 = bVar8;
      na = na - 1;
      puVar3 = a + na;
      uVar4 = *puVar3;
      *puVar3 = *puVar3 - 1;
      if (uVar4 != 0) {
        bVar7 = false;
      }
    } while ((na != 0) && (bVar8 = bVar7, bVar7));
  }
  if (bVar7) {
    __assert_fail("!carry",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                  ,0x4ca,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
  }
  return;
}

Assistant:

static void subip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	bool carry = false;
	size_t ia = na, ib = nb;

	while (ib > 0 && ia > 0) {
		--ia;
		--ib;
		if (carry) {
			if (a[ia] > b[ib]) {
				a[ia] -= b[ib] + 1;
				carry = false;
			} else {
				a[ia] += (uint16_t)65535 - b[ib];
				carry = true;
			}
		} else if (a[ia] >= b[ib]) {
			a[ia] -= b[ib];
		} else {
			a[ia] += (uint16_t)65535 - (b[ib] - 1);
			carry = true;
		}
	}
#ifndef NDEBUG
	while (ib > 0) {
		--ib;
		assert(!b[ib]);
	}
#endif
	while (ia > 0 && carry) {
		--ia;
		if (a[ia]) {
			a[ia] -= 1;
			carry = false;
		} else {
			a[ia] = 65535;
		}
	}
	assert(!carry);
}